

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBlur.cpp
# Opt level: O0

SharedPtr<Filter> __thiscall
Rml::FilterBlurInstancer::InstanceFilter
          (FilterBlurInstancer *this,String *param_1,PropertyDictionary *properties)

{
  bool bVar1;
  element_type *this_00;
  NumericValue in_sigma;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SharedPtr<Filter> SVar3;
  undefined1 local_40 [8];
  SharedPtr<Rml::FilterBlur> decorator;
  Property *p_radius;
  PropertyDictionary *properties_local;
  String *param_1_local;
  FilterBlurInstancer *this_local;
  
  decorator.super___shared_ptr<Rml::FilterBlur,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[8]);
  if ((Property *)
      decorator.super___shared_ptr<Rml::FilterBlur,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (Property *)0x0) {
    ::std::shared_ptr<Rml::Filter>::shared_ptr((shared_ptr<Rml::Filter> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    MakeShared<Rml::FilterBlur>();
    this_00 = ::std::__shared_ptr_access<Rml::FilterBlur,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Rml::FilterBlur,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
    in_sigma = Property::GetNumericValue
                         ((Property *)
                          decorator.super___shared_ptr<Rml::FilterBlur,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
    bVar1 = FilterBlur::Initialise(this_00,in_sigma);
    if (bVar1) {
      ::std::shared_ptr<Rml::Filter>::shared_ptr<Rml::FilterBlur,void>
                ((shared_ptr<Rml::Filter> *)this,(shared_ptr<Rml::FilterBlur> *)local_40);
    }
    else {
      ::std::shared_ptr<Rml::Filter>::shared_ptr((shared_ptr<Rml::Filter> *)this,(nullptr_t)0x0);
    }
    ::std::shared_ptr<Rml::FilterBlur>::~shared_ptr((shared_ptr<Rml::FilterBlur> *)local_40);
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar3.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBlurInstancer::InstanceFilter(const String& /*name*/, const PropertyDictionary& properties)
{
	const Property* p_radius = properties.GetProperty(ids.sigma);
	if (!p_radius)
		return nullptr;

	auto decorator = MakeShared<FilterBlur>();
	if (decorator->Initialise(p_radius->GetNumericValue()))
		return decorator;

	return nullptr;
}